

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * atomvec_a(iasctx *ctx,void *v,int spos)

{
  litem *plVar1;
  undefined8 uVar2;
  char *__s1;
  char *__s;
  ulonglong uVar3;
  uint uVar4;
  int iVar5;
  undefined8 *__ptr;
  size_t sVar6;
  ulonglong uVar7;
  matches *pmVar8;
  match *__dest;
  long lVar9;
  ulonglong uVar10;
  ull num;
  undefined8 *puVar11;
  ulong uVar12;
  ulong uVar13;
  easm_expr *peVar14;
  ulong num_00;
  bool bVar15;
  char *end;
  match res;
  ulonglong local_118;
  char *local_f0;
  match local_e8;
  
  if (ctx->atomsnum == spos) {
    return (matches *)0x0;
  }
  plVar1 = ctx->atoms[spos];
  num = 0;
  if (plVar1->type != LITEM_EXPR) {
    return (matches *)0x0;
  }
  memset(&local_e8,0,0xb8);
  local_e8.lpos = spos + 1;
  peVar14 = plVar1->expr;
  if (peVar14->type == EASM_EXPR_ZVEC) {
    local_118 = 0;
    num_00 = 0;
  }
  else {
    if (peVar14->type == EASM_EXPR_VEC) {
      num = 0;
      __ptr = (undefined8 *)0x0;
      iVar5 = 0;
      do {
        if ((long)iVar5 <= (long)num) {
          bVar15 = iVar5 == 0;
          iVar5 = iVar5 * 2;
          if (bVar15) {
            iVar5 = 0x10;
          }
          __ptr = (undefined8 *)realloc(__ptr,(long)iVar5 << 3);
        }
        __ptr[num] = peVar14->e2;
        num = num + 1;
        peVar14 = peVar14->e1;
      } while (peVar14->type == EASM_EXPR_VEC);
      if (iVar5 <= (int)num) {
        sVar6 = 0x80;
        if (iVar5 != 0) {
          sVar6 = (long)(iVar5 * 2) << 3;
        }
        goto LAB_0026da1c;
      }
    }
    else {
      __ptr = (undefined8 *)0x0;
      sVar6 = 0x80;
LAB_0026da1c:
      __ptr = (undefined8 *)realloc(__ptr,sVar6);
    }
    uVar4 = (int)num + 1;
    __ptr[num & 0xffffffff] = peVar14;
    uVar12 = (ulong)uVar4;
    if ((int)num < 1) {
      num = (long)(int)uVar4;
    }
    else {
      lVar9 = 0;
      puVar11 = __ptr;
      do {
        uVar2 = *puVar11;
        *puVar11 = __ptr[uVar12 + lVar9 + -1];
        __ptr[uVar12 + lVar9 + -1] = uVar2;
        puVar11 = puVar11 + 1;
        lVar9 = lVar9 + -1;
        num = uVar12;
      } while (-lVar9 != (ulong)(uVar4 >> 1));
    }
    uVar13 = 0;
    uVar10 = 0;
    num_00 = 0;
    local_118 = 0;
    do {
      iVar5 = *(int *)__ptr[uVar13];
      if (iVar5 != 0x14) {
        if (iVar5 != 0x11) {
          return (matches *)0x0;
        }
        __s1 = *(char **)((int *)__ptr[uVar13] + 0x10);
        __s = *v;
        sVar6 = strlen(__s);
        iVar5 = strncmp(__s1,__s,sVar6);
        if (iVar5 != 0) {
          return (matches *)0x0;
        }
        uVar7 = strtoull(__s1 + sVar6,&local_f0,10);
        if (*local_f0 != '\0') {
          return (matches *)0x0;
        }
        uVar3 = uVar7;
        if ((num_00 != 0) && (bVar15 = uVar7 != uVar10, uVar7 = uVar10, uVar3 = local_118, bVar15))
        {
          return (matches *)0x0;
        }
        local_118 = uVar3;
        uVar10 = uVar7 + 1;
        num_00 = num_00 | 1L << (uVar13 & 0x3f);
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  iVar5 = setbf(&local_e8,*(bitfield **)((long)v + 8),local_118);
  if ((iVar5 != 0) && (iVar5 = setbf(&local_e8,*(bitfield **)((long)v + 0x10),num), iVar5 != 0)) {
    if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
      if ((num_00 ^ -1L << ((byte)num & 0x3f)) == 0xffffffffffffffff) goto LAB_0026dba7;
    }
    else {
      iVar5 = setbf(&local_e8,*(bitfield **)((long)v + 0x18),num_00);
      if (iVar5 != 0) {
LAB_0026dba7:
        pmVar8 = (matches *)calloc(0x10,1);
        pmVar8->mmax = 0x10;
        __dest = (match *)malloc(0xb80);
        pmVar8->m = __dest;
        pmVar8->mnum = 1;
        memcpy(__dest,&local_e8,0xb8);
        return pmVar8;
      }
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomvec_a APROTO {
	const struct vec *vec = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct match res = { 0, .lpos = spos+1 };
	const struct easm_expr *expr = ctx->atoms[spos]->expr;
	const struct easm_expr **vexprs = 0;
	int vexprsnum = 0;
	int vexprsmax = 0;
	if (expr->type != EASM_EXPR_ZVEC) {
		while (expr->type == EASM_EXPR_VEC) {
			ADDARRAY(vexprs, expr->e2);
			expr = expr->e1;
		}
		ADDARRAY(vexprs, expr);
	}
	int i;
	for (i = 0; i < vexprsnum/2; i++) {
		const struct easm_expr *tmp = vexprs[i];
		vexprs[i] = vexprs[vexprsnum-1-i];
		vexprs[vexprsnum-1-i] = tmp;
	}
	ull start = 0, cnt = vexprsnum, mask = 0, cur = 0;
	for (i = 0; i < cnt; i++) {
		const struct easm_expr *e = vexprs[i];
		if (e->type == EASM_EXPR_DISCARD) {
		} else if (e->type == EASM_EXPR_REG) {
			if (strncmp(e->str, vec->name, strlen(vec->name)))
				return 0;
			char *end;
			ull num = strtoull(e->str + strlen(vec->name), &end, 10);
			if (*end)
				return 0;
			if (mask) {
				if (num != cur)
					return 0;
				cur++;
			} else {
				start = num;
				cur = num + 1;
			}
			mask |= 1ull << i;
		} else {
			return 0;
		}
	}
	if (!setbf(&res, vec->bf, start))
		return 0;
	if (!setbf(&res, vec->cnt, cnt))
		return 0;
	if (vec->mask) {
		if (!setbf(&res, vec->mask, mask))
			return 0;
	} else {
		if (mask != (1ull << cnt) - 1)
		       return 0;	
	}
	struct matches *rres = emptymatches();
	ADDARRAY(rres->m, res);
	return rres;
}